

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxVisitor.h
# Opt level: O1

void __thiscall
slang::syntax::SyntaxVisitor<CATCH2_INTERNAL_TEST_8()::MultipleRewriter>::
visit<slang::syntax::FunctionDeclarationSyntax&>
          (SyntaxVisitor<CATCH2_INTERNAL_TEST_8()::MultipleRewriter> *this,
          FunctionDeclarationSyntax *t)

{
  pointer *ppSVar1;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>>>
  *arrays_;
  char *pcVar2;
  FunctionPortListSyntax *pFVar3;
  iterator iVar4;
  int iVar5;
  undefined1 auVar6 [16];
  ulong uVar7;
  value_type *elements_1;
  SyntaxNode *pSVar8;
  uint uVar9;
  pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>
  *ppVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong hash;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  Token TVar21;
  Token TVar22;
  string_view name;
  string_view name_00;
  locator res;
  try_emplace_args_t local_91;
  SyntaxNode *local_90;
  table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>>>
  *local_88;
  undefined1 local_80 [16];
  Token local_70;
  Info *local_60;
  undefined8 local_58;
  FunctionPortSyntax *local_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  ulong local_38;
  
  pFVar3 = ((t->prototype).ptr)->portList;
  if (pFVar3 != (FunctionPortListSyntax *)0x0) {
    name._M_str = "argA";
    name._M_len = 4;
    local_50 = RewriterBase<MultipleRewriter>::makeArg((RewriterBase<MultipleRewriter> *)this,name);
    TVar21 = SyntaxRewriter<MultipleRewriter>::makeComma((SyntaxRewriter<MultipleRewriter> *)this);
    local_60 = TVar21.info;
    local_58 = TVar21._0_8_;
    local_88 = (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>>>
                *)(this + 0xb0);
    pSVar8 = &(pFVar3->ports).super_SyntaxListBase.super_SyntaxNode;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = pSVar8;
    hash = SUB168(auVar6 * ZEXT816(0x9e3779b97f4a7c15),8) ^
           SUB168(auVar6 * ZEXT816(0x9e3779b97f4a7c15),0);
    uVar7 = hash >> ((byte)this[0xb0] & 0x3f);
    uStack_40 = (&boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)
                  ::word)[hash & 0xff];
    uVar14 = (ulong)((uint)hash & 7);
    uVar13 = 0;
    uVar12 = uVar7;
    do {
      pcVar2 = (char *)(*(long *)(this + 0xc0) + uVar12 * 0x10);
      cVar17 = (char)uStack_40;
      auVar15[0] = -(*pcVar2 == cVar17);
      cVar18 = (char)((uint)uStack_40 >> 8);
      auVar15[1] = -(pcVar2[1] == cVar18);
      cVar19 = (char)((uint)uStack_40 >> 0x10);
      auVar15[2] = -(pcVar2[2] == cVar19);
      cVar20 = (char)((uint)uStack_40 >> 0x18);
      auVar15[3] = -(pcVar2[3] == cVar20);
      auVar15[4] = -(pcVar2[4] == cVar17);
      auVar15[5] = -(pcVar2[5] == cVar18);
      auVar15[6] = -(pcVar2[6] == cVar19);
      auVar15[7] = -(pcVar2[7] == cVar20);
      auVar15[8] = -(pcVar2[8] == cVar17);
      auVar15[9] = -(pcVar2[9] == cVar18);
      auVar15[10] = -(pcVar2[10] == cVar19);
      auVar15[0xb] = -(pcVar2[0xb] == cVar20);
      auVar15[0xc] = -(pcVar2[0xc] == cVar17);
      auVar15[0xd] = -(pcVar2[0xd] == cVar18);
      auVar15[0xe] = -(pcVar2[0xe] == cVar19);
      auVar15[0xf] = -(pcVar2[0xf] == cVar20);
      uVar9 = (uint)(ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe);
      if (uVar9 != 0) {
        lVar11 = *(long *)(this + 200) + uVar12 * 0x1e0;
        do {
          iVar5 = 0;
          if (uVar9 != 0) {
            for (; (uVar9 >> iVar5 & 1) == 0; iVar5 = iVar5 + 1) {
            }
          }
          if (pSVar8 == (SyntaxNode *)*(undefined1 **)(lVar11 + (ulong)(uint)(iVar5 << 5))) {
            ppVar10 = (pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>
                       *)((ulong)(uint)(iVar5 << 5) + lVar11);
            goto LAB_0047cd8c;
          }
          uVar9 = uVar9 - 1 & uVar9;
        } while (uVar9 != 0);
      }
      if ((*(byte *)(uVar12 * 0x10 + *(long *)(this + 0xc0) + 0xf) &
          (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            is_not_overflowed(unsigned_long)::shift)[uVar14]) == 0) break;
      lVar11 = uVar12 + uVar13;
      uVar13 = uVar13 + 1;
      uVar12 = lVar11 + 1U & *(ulong *)(this + 0xb8);
    } while (uVar13 <= *(ulong *)(this + 0xb8));
    ppVar10 = (pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>
               *)0x0;
LAB_0047cd8c:
    _local_48 = CONCAT44(uStack_40,uStack_40);
    local_90 = pSVar8;
    uStack_3c = uStack_40;
    if (ppVar10 ==
        (pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>
         *)0x0) {
      if (*(ulong *)(this + 0xd8) < *(ulong *)(this + 0xd0)) {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>>>
        ::
        nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*>
                  ((locator *)local_80,local_88,(arrays_type *)local_88,uVar7,hash,&local_91,
                   &local_90);
        *(long *)(this + 0xd8) = *(long *)(this + 0xd8) + 1;
      }
      else {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>>>
        ::
        unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*>
                  ((locator *)local_80,local_88,hash,&local_91,&local_90);
      }
      TVar21.info = local_60;
      TVar21.kind = (undefined2)local_58;
      TVar21._2_1_ = local_58._2_1_;
      TVar21.numFlags.raw = local_58._3_1_;
      TVar21.rawLen = local_58._4_4_;
      ppVar10 = (pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>
                 *)local_70._0_8_;
    }
    local_60 = TVar21.info;
    local_58 = TVar21._0_8_;
    local_80._8_8_ = local_50;
    iVar4._M_current =
         (ppVar10->second).
         super__Vector_base<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_80._0_8_ = pSVar8;
    local_38 = uVar14;
    local_70 = TVar21;
    if (iVar4._M_current ==
        (ppVar10->second).
        super__Vector_base<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>
      ::_M_realloc_insert<slang::syntax::detail::SyntaxChange>
                (&ppVar10->second,iVar4,(SyntaxChange *)local_80);
      TVar21.info = local_60;
      TVar21.kind = (undefined2)local_58;
      TVar21._2_1_ = local_58._2_1_;
      TVar21.numFlags.raw = local_58._3_1_;
      TVar21.rawLen = local_58._4_4_;
    }
    else {
      (iVar4._M_current)->separator = TVar21;
      (iVar4._M_current)->first = pSVar8;
      (iVar4._M_current)->second = (SyntaxNode *)local_50;
      ppSVar1 = &(ppVar10->second).
                 super__Vector_base<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppSVar1 = *ppSVar1 + 1;
    }
    local_60 = TVar21.info;
    local_58 = TVar21._0_8_;
    name_00._M_str = "argZ";
    name_00._M_len = 4;
    local_50 = RewriterBase<MultipleRewriter>::makeArg
                         ((RewriterBase<MultipleRewriter> *)this,name_00);
    TVar22 = SyntaxRewriter<MultipleRewriter>::makeComma((SyntaxRewriter<MultipleRewriter> *)this);
    local_60 = TVar22.info;
    local_58 = TVar22._0_8_;
    arrays_ = (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>>>
               *)(this + 0xe0);
    uVar7 = hash >> ((byte)this[0xe0] & 0x3f);
    local_88 = *(table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>>>
                 **)(this + 0xe8);
    uVar14 = 0;
    uVar12 = uVar7;
    do {
      pcVar2 = (char *)(*(long *)(this + 0xf0) + uVar12 * 0x10);
      auVar16[0] = -(*pcVar2 == (char)local_48);
      auVar16[1] = -(pcVar2[1] == local_48._1_1_);
      auVar16[2] = -(pcVar2[2] == local_48._2_1_);
      auVar16[3] = -(pcVar2[3] == local_48._3_1_);
      auVar16[4] = -(pcVar2[4] == (char)uStack_44);
      auVar16[5] = -(pcVar2[5] == uStack_44._1_1_);
      auVar16[6] = -(pcVar2[6] == uStack_44._2_1_);
      auVar16[7] = -(pcVar2[7] == uStack_44._3_1_);
      auVar16[8] = -(pcVar2[8] == (char)uStack_40);
      auVar16[9] = -(pcVar2[9] == uStack_40._1_1_);
      auVar16[10] = -(pcVar2[10] == uStack_40._2_1_);
      auVar16[0xb] = -(pcVar2[0xb] == uStack_40._3_1_);
      auVar16[0xc] = -(pcVar2[0xc] == (char)uStack_3c);
      auVar16[0xd] = -(pcVar2[0xd] == uStack_3c._1_1_);
      auVar16[0xe] = -(pcVar2[0xe] == uStack_3c._2_1_);
      auVar16[0xf] = -(pcVar2[0xf] == uStack_3c._3_1_);
      uVar9 = (uint)(ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe);
      if (uVar9 != 0) {
        lVar11 = *(long *)(this + 0xf8) + uVar12 * 0x1e0;
        do {
          iVar5 = 0;
          if (uVar9 != 0) {
            for (; (uVar9 >> iVar5 & 1) == 0; iVar5 = iVar5 + 1) {
            }
          }
          if (pSVar8 == (SyntaxNode *)*(undefined1 **)(lVar11 + (ulong)(uint)(iVar5 << 5))) {
            ppVar10 = (pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>
                       *)((ulong)(uint)(iVar5 << 5) + lVar11);
            goto LAB_0047cf3f;
          }
          uVar9 = uVar9 - 1 & uVar9;
        } while (uVar9 != 0);
      }
      if ((*(byte *)(uVar12 * 0x10 + *(long *)(this + 0xf0) + 0xf) &
          (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            is_not_overflowed(unsigned_long)::shift)[local_38]) == 0) break;
      lVar11 = uVar12 + uVar14;
      uVar14 = uVar14 + 1;
      uVar12 = lVar11 + 1U & (ulong)local_88;
    } while (uVar14 <= local_88);
    ppVar10 = (pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>
               *)0x0;
LAB_0047cf3f:
    local_90 = pSVar8;
    if (ppVar10 ==
        (pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>
         *)0x0) {
      if (*(ulong *)(this + 0x108) < *(ulong *)(this + 0x100)) {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>>>
        ::
        nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*>
                  ((locator *)local_80,arrays_,(arrays_type *)arrays_,uVar7,hash,&local_91,&local_90
                  );
        TVar22.info = local_60;
        TVar22.kind = (undefined2)local_58;
        TVar22._2_1_ = local_58._2_1_;
        TVar22.numFlags.raw = local_58._3_1_;
        TVar22.rawLen = local_58._4_4_;
        *(long *)(this + 0x108) = *(long *)(this + 0x108) + 1;
        ppVar10 = (pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>
                   *)local_70._0_8_;
      }
      else {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,std::vector<slang::syntax::detail::SyntaxChange,std::allocator<slang::syntax::detail::SyntaxChange>>>>>
        ::
        unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*>
                  ((locator *)local_80,arrays_,hash,&local_91,&local_90);
        TVar22.info = local_60;
        TVar22.kind = (undefined2)local_58;
        TVar22._2_1_ = local_58._2_1_;
        TVar22.numFlags.raw = local_58._3_1_;
        TVar22.rawLen = local_58._4_4_;
        ppVar10 = (pair<const_slang::syntax::SyntaxNode_*const,_std::vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>_>
                   *)local_70._0_8_;
      }
    }
    local_60 = TVar22.info;
    local_58 = TVar22._0_8_;
    local_80._8_8_ = local_50;
    iVar4._M_current =
         (ppVar10->second).
         super__Vector_base<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar4._M_current ==
        (ppVar10->second).
        super__Vector_base<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      local_80._0_8_ = pSVar8;
      local_70 = TVar22;
      std::
      vector<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>
      ::_M_realloc_insert<slang::syntax::detail::SyntaxChange>
                (&ppVar10->second,iVar4,(SyntaxChange *)local_80);
    }
    else {
      (iVar4._M_current)->separator = TVar22;
      (iVar4._M_current)->first = pSVar8;
      (iVar4._M_current)->second = (SyntaxNode *)local_50;
      ppSVar1 = &(ppVar10->second).
                 super__Vector_base<slang::syntax::detail::SyntaxChange,_std::allocator<slang::syntax::detail::SyntaxChange>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppSVar1 = *ppSVar1 + 1;
    }
  }
  return;
}

Assistant:

void insertAtBack(const SyntaxListBase& list, SyntaxNode& newNode, Token separator = {}) {
        commits.listInsertAtBack[&list].push_back({&list, &newNode, separator});
    }